

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O0

void Sfm_LibTruth8Two(Mio_Cell2_t *pCellBot,Mio_Cell2_t *pCellTop,int InTop,word *pRes)

{
  uint local_90;
  int local_8c;
  int k;
  int i;
  word *puFanins [8];
  word uTruthBot [4];
  word *pRes_local;
  int InTop_local;
  Mio_Cell2_t *pCellTop_local;
  Mio_Cell2_t *pCellBot_local;
  
  Exp_Truth8(*(uint *)&pCellBot->field_0x10 >> 0x1c,pCellBot->vExpr,(word **)0x0,
             (word *)(puFanins + 7));
  if ((InTop < 0) || ((int)(*(uint *)&pCellTop->field_0x10 >> 0x1c) <= InTop)) {
    __assert_fail("InTop >= 0 && InTop < (int)pCellTop->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                  ,0x10e,"void Sfm_LibTruth8Two(Mio_Cell2_t *, Mio_Cell2_t *, int, word *)");
  }
  local_8c = 0;
  local_90 = *(uint *)&pCellBot->field_0x10 >> 0x1c;
  for (; local_8c < (int)(*(uint *)&pCellTop->field_0x10 >> 0x1c); local_8c = local_8c + 1) {
    if (local_8c == InTop) {
      *(word ***)(&k + (long)local_8c * 2) = puFanins + 7;
    }
    else {
      *(word (**) [4])(&k + (long)local_8c * 2) = s_Truth8 + (int)local_90;
      local_90 = local_90 + 1;
    }
  }
  if ((*(uint *)&pCellBot->field_0x10 >> 0x1c) + (*(uint *)&pCellTop->field_0x10 >> 0x1c) ==
      local_90 + 1) {
    Exp_Truth8(*(uint *)&pCellTop->field_0x10 >> 0x1c,pCellTop->vExpr,(word **)&k,pRes);
    return;
  }
  __assert_fail("(int)pCellBot->nFanins + (int)pCellTop->nFanins == k + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmLib.c"
                ,0x114,"void Sfm_LibTruth8Two(Mio_Cell2_t *, Mio_Cell2_t *, int, word *)");
}

Assistant:

void Sfm_LibTruth8Two( Mio_Cell2_t * pCellBot, Mio_Cell2_t * pCellTop, int InTop, word * pRes )
{
    word uTruthBot[4], * puFanins[SFM_SUPP_MAX]; int i, k;
    Exp_Truth8( pCellBot->nFanins, pCellBot->vExpr, NULL, uTruthBot );
    assert( InTop >= 0 && InTop < (int)pCellTop->nFanins );
    for ( i = 0, k = pCellBot->nFanins; i < (int)pCellTop->nFanins; i++ )
        if ( i == InTop )
            puFanins[i] = uTruthBot;
        else
            puFanins[i] = s_Truth8[k++];
    assert( (int)pCellBot->nFanins + (int)pCellTop->nFanins == k + 1 );
    Exp_Truth8( pCellTop->nFanins, pCellTop->vExpr, puFanins, pRes );
}